

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psusan.c
# Opt level: O3

void show_help(FILE *fp)

{
  fputs("usage:   psusan [options]\noptions: --listen SOCKETPATH  listen for connections on a Unix-domain socket\n         --listen-once        (with --listen) stop after one connection\n         --verbose            print log messages to standard error\n         --sessiondir DIR     cwd for session subprocess (default $HOME)\n         --sshlog FILE        write ssh-connection packet log to FILE\n         --sshrawlog FILE     write packets and raw data log to FILE\nalso:    psusan --help        show this text\n         psusan --version     show version information\n"
        ,(FILE *)fp);
  return;
}

Assistant:

static void show_help(FILE *fp)
{
    fputs("usage:   psusan [options]\n"
          "options: --listen SOCKETPATH  listen for connections on a Unix-domain socket\n"
          "         --listen-once        (with --listen) stop after one connection\n"
          "         --verbose            print log messages to standard error\n"
          "         --sessiondir DIR     cwd for session subprocess (default $HOME)\n"
          "         --sshlog FILE        write ssh-connection packet log to FILE\n"
          "         --sshrawlog FILE     write packets and raw data log to FILE\n"
          "also:    psusan --help        show this text\n"
          "         psusan --version     show version information\n", fp);
}